

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  char *pcVar6;
  const_reference ppcVar7;
  char *pcVar8;
  reference ppcVar9;
  cmMakefile *makefile_00;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar10;
  string *psVar11;
  long lVar12;
  undefined1 local_180 [8];
  string fastTarget;
  string targetName;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_138;
  iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_108;
  const_iterator lg;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8 [8];
  string compiler;
  allocator local_71;
  string local_70;
  string local_50 [8];
  string make;
  MapSourceFileFlags *sourceFileFlags_local;
  cmGeneratedFileStream *fout_local;
  cmMakefile *mf_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  make.field_2._8_8_ = sourceFileFlags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_MAKE_PROGRAM",&local_71);
  pcVar6 = cmMakefile::GetRequiredDefinition(mf,&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar6,(allocator *)(compiler.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(compiler.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"",&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  bVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty(lgs);
  if (!bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"all",&local_d1);
    ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar1 = *ppcVar7;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,fout,&local_d0,pcVar1,(cmGeneratorTarget *)0x0,pcVar6,mf,pcVar8,
                 (MapSourceFileFlags *)make.field_2._8_8_,true);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f8,"clean",(allocator *)((long)&lg._M_current + 7));
    ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar1 = *ppcVar7;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,fout,&local_f8,pcVar1,(cmGeneratorTarget *)0x0,pcVar6,mf,pcVar8,
                 (MapSourceFileFlags *)make.field_2._8_8_,false);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lg._M_current + 7));
  }
  local_108._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
  while( true ) {
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    bVar3 = __gnu_cxx::operator!=
                      (&local_108,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar3) break;
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_108);
    makefile_00 = cmLocalGenerator::GetMakefile(*ppcVar9);
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_108);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar9);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x);
    local_138._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      targetName.field_2._8_8_ =
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      bVar3 = __gnu_cxx::operator!=
                        (&local_138,
                         (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)((long)&targetName.field_2 + 8));
      if (!bVar3) break;
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                 ::operator*(&local_138);
      psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar10);
      std::__cxx11::string::string
                ((string *)(fastTarget.field_2._M_local_buf + 8),(string *)psVar11);
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                 ::operator*(&local_138);
      TVar4 = cmGeneratorTarget::GetType(*ppcVar10);
      if (TVar4 < UTILITY) {
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_108);
        pcVar1 = *ppcVar9;
        ppcVar10 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&local_138);
        pcVar2 = *ppcVar10;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,fout,(string *)((long)&fastTarget.field_2 + 8),pcVar1,pcVar2,pcVar6,
                     makefile_00,pcVar8,(MapSourceFileFlags *)make.field_2._8_8_,false);
        std::__cxx11::string::string
                  ((string *)local_180,(string *)(fastTarget.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_180,"/fast");
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_108);
        pcVar1 = *ppcVar9;
        ppcVar10 = __gnu_cxx::
                   __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                   ::operator*(&local_138);
        pcVar2 = *ppcVar10;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,fout,(string *)local_180,pcVar1,pcVar2,pcVar6,makefile_00,pcVar8,
                     (MapSourceFileFlags *)make.field_2._8_8_,false);
        std::__cxx11::string::~string((string *)local_180);
      }
      else if (TVar4 == UTILITY) {
        lVar12 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0xa6ff00);
        if ((((lVar12 != 0) ||
             (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&fastTarget.field_2 + 8),"Nightly"), !bVar3)) &&
            ((lVar12 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0xa6fdfc),
             lVar12 != 0 ||
             (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&fastTarget.field_2 + 8),"Continuous"), !bVar3))))
           && ((lVar12 = std::__cxx11::string::find(fastTarget.field_2._M_local_buf + 8,0xa6fe7b),
               lVar12 != 0 ||
               (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&fastTarget.field_2 + 8),"Experimental"), !bVar3))
              )) {
          ppcVar9 = __gnu_cxx::
                    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                    ::operator*(&local_108);
          pcVar1 = *ppcVar9;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,fout,(string *)((long)&fastTarget.field_2 + 8),pcVar1,
                       (cmGeneratorTarget *)0x0,pcVar6,makefile_00,pcVar8,
                       (MapSourceFileFlags *)make.field_2._8_8_,false);
        }
      }
      else if (TVar4 == GLOBAL_TARGET) {
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_108);
        pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar9);
        ppcVar9 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_108);
        pcVar8 = cmLocalGenerator::GetBinaryDirectory(*ppcVar9);
        iVar5 = strcmp(pcVar6,pcVar8);
        if (iVar5 == 0) {
          ppcVar9 = __gnu_cxx::
                    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                    ::operator*(&local_108);
          pcVar1 = *ppcVar9;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,fout,(string *)((long)&fastTarget.field_2 + 8),pcVar1,
                       (cmGeneratorTarget *)0x0,pcVar6,makefile_00,pcVar8,
                       (MapSourceFileFlags *)make.field_2._8_8_,false);
        }
      }
      std::__cxx11::string::~string((string *)(fastTarget.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_138,0);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_108,0);
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory())==0)
            {
            this->AppendTarget(fout, targetName, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
             || ((targetName.find("Continuous")==0)
                 &&(targetName!="Continuous"))
             || ((targetName.find("Experimental")==0)
                 && (targetName!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, targetName, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, targetName, *lg, *ti,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, *ti,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}